

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O2

void __thiscall QMakeSourceFileInfo::QMakeSourceFileInfo(QMakeSourceFileInfo *this)

{
  this->_vptr_QMakeSourceFileInfo = (_func_int **)&PTR_fixPathForFile_002680b8;
  this->files = (SourceFiles *)0x0;
  this->includes = (SourceFiles *)0x0;
  this->files_changed = false;
  (this->depdirs).d.d = (Data *)0x0;
  (this->depdirs).d.ptr = (QMakeLocalFileName *)0x0;
  (this->depdirs).d.size = 0;
  (this->systemIncludes).d.d = (Data *)0x0;
  (this->systemIncludes).d.ptr = (QString *)0x0;
  (this->systemIncludes).d.size = 0;
  this->spare_buffer = (char *)0x0;
  this->spare_buffer_size = 0;
  this->dep_mode = Recursive;
  return;
}

Assistant:

QMakeSourceFileInfo::QMakeSourceFileInfo()
{
    //dep_mode
    dep_mode = Recursive;

    //quick project lookups
    includes = files = nullptr;
    files_changed = false;

    //buffer
    spare_buffer = nullptr;
    spare_buffer_size = 0;
}